

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadBranchElimPass::GetConstCondition
          (DeadBranchElimPass *this,uint32_t condId,bool *condVal)

{
  Op OVar1;
  uint32_t condId_00;
  DefUseManager *this_00;
  bool local_31;
  Instruction *pIStack_30;
  bool negVal;
  Instruction *cInst;
  bool *pbStack_20;
  bool condIsConst;
  bool *condVal_local;
  DeadBranchElimPass *pDStack_10;
  uint32_t condId_local;
  DeadBranchElimPass *this_local;
  
  pbStack_20 = condVal;
  condVal_local._4_4_ = condId;
  pDStack_10 = this;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  pIStack_30 = analysis::DefUseManager::GetDef(this_00,condVal_local._4_4_);
  OVar1 = opt::Instruction::opcode(pIStack_30);
  if (OVar1 == OpConstantTrue) {
    *pbStack_20 = true;
    cInst._7_1_ = true;
  }
  else if ((OVar1 == OpConstantFalse) || (OVar1 == OpConstantNull)) {
    *pbStack_20 = false;
    cInst._7_1_ = true;
  }
  else if (OVar1 == OpLogicalNot) {
    condId_00 = opt::Instruction::GetSingleWordInOperand(pIStack_30,0);
    cInst._7_1_ = GetConstCondition(this,condId_00,&local_31);
    if (cInst._7_1_) {
      *pbStack_20 = (bool)((local_31 ^ 0xffU) & 1);
    }
  }
  else {
    cInst._7_1_ = false;
  }
  return cInst._7_1_;
}

Assistant:

bool DeadBranchElimPass::GetConstCondition(uint32_t condId, bool* condVal) {
  bool condIsConst;
  Instruction* cInst = get_def_use_mgr()->GetDef(condId);
  switch (cInst->opcode()) {
    case spv::Op::OpConstantNull:
    case spv::Op::OpConstantFalse: {
      *condVal = false;
      condIsConst = true;
    } break;
    case spv::Op::OpConstantTrue: {
      *condVal = true;
      condIsConst = true;
    } break;
    case spv::Op::OpLogicalNot: {
      bool negVal;
      condIsConst =
          GetConstCondition(cInst->GetSingleWordInOperand(0), &negVal);
      if (condIsConst) *condVal = !negVal;
    } break;
    default: { condIsConst = false; } break;
  }
  return condIsConst;
}